

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O3

int __thiscall
ncnn::InstanceNorm::forward_inplace(InstanceNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  uint uVar6;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  ulong uVar7;
  
  iVar1 = this->channels;
  if (0 < (long)iVar1) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w;
    uVar7 = (ulong)uVar6;
    pvVar8 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    pvVar3 = (this->gamma_data).data;
    pvVar4 = (this->beta_data).data;
    sVar5 = bottom_top_blob->elemsize;
    lVar9 = 0;
    do {
      fVar11 = 0.0;
      if ((int)uVar6 < 1) {
LAB_0016c78b:
        fVar12 = 0.0;
      }
      else {
        uVar10 = 0;
        do {
          fVar11 = fVar11 + *(float *)((long)pvVar8 + uVar10 * 4);
          uVar10 = uVar10 + 1;
        } while (uVar7 != uVar10);
        fVar11 = fVar11 * (1.0 / (float)(int)uVar6);
        if ((int)uVar6 < 1) goto LAB_0016c78b;
        fVar12 = 0.0;
        uVar10 = 0;
        do {
          fVar14 = *(float *)((long)pvVar8 + uVar10 * 4) - fVar11;
          fVar12 = fVar12 + fVar14 * fVar14;
          uVar10 = uVar10 + 1;
        } while (uVar7 != uVar10);
      }
      if (0 < (int)uVar6) {
        fVar14 = *(float *)((long)pvVar3 + lVar9 * 4);
        fVar13 = fVar12 * (1.0 / (float)(int)uVar6) + this->eps;
        fVar12 = *(float *)((long)pvVar4 + lVar9 * 4);
        auVar16 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar13));
        fVar15 = auVar16._0_4_;
        uVar10 = 0;
        do {
          *(float *)((long)pvVar8 + uVar10 * 4) =
               (*(float *)((long)pvVar8 + uVar10 * 4) - fVar11) * fVar14 *
               fVar15 * -0.5 * (fVar13 * fVar15 * fVar15 + -3.0) + fVar12;
          uVar10 = uVar10 + 1;
        } while (uVar7 != uVar10);
      }
      lVar9 = lVar9 + 1;
      pvVar8 = (void *)((long)pvVar8 + sVar2 * sVar5);
    } while (lVar9 != iVar1);
  }
  return 0;
}

Assistant:

int InstanceNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / (sqrt(var) + eps) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i=0; i<size; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / size;
        float tmp = 0.f;
        for (int i=0; i<size; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / size;
        // the var maybe minus due to accuracy
        //float var = sqsum / size - mean * mean;

        float gamma = gamma_data[q];
        float beta = beta_data[q];

        float a = gamma / (sqrt(var + eps));
        float b = - mean * a + beta;

        for (int i=0; i<size; i++)
        {
            ptr[i] = ptr[i] * a + b;
        }
    }

    return 0;
}